

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O3

bool __thiscall SessionManager::haveROSession(SessionManager *this,CK_SLOT_ID slotID)

{
  bool bVar1;
  Slot *this_00;
  CK_SLOT_ID CVar2;
  pointer ppSVar3;
  MutexLocker lock;
  MutexLocker MStack_28;
  
  MutexLocker::MutexLocker(&MStack_28,this->sessionsMutex);
  ppSVar3 = (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (ppSVar3 ==
        (this->sessions).super__Vector_base<Session_*,_std::allocator<Session_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar1 = false;
LAB_0016f4e5:
      MutexLocker::~MutexLocker(&MStack_28);
      return bVar1;
    }
    if (*ppSVar3 != (Session *)0x0) {
      this_00 = Session::getSlot(*ppSVar3);
      CVar2 = Slot::getSlotID(this_00);
      if (CVar2 == slotID) {
        bVar1 = Session::isRW(*ppSVar3);
        if (!bVar1) {
          bVar1 = true;
          goto LAB_0016f4e5;
        }
      }
    }
    ppSVar3 = ppSVar3 + 1;
  } while( true );
}

Assistant:

bool SessionManager::haveROSession(CK_SLOT_ID slotID)
{
	// Lock access to the vector
	MutexLocker lock(sessionsMutex);

	for (std::vector<Session*>::iterator i = sessions.begin(); i != sessions.end(); i++)
	{
		if (*i == NULL) continue;

		if ((*i)->getSlot()->getSlotID() != slotID) continue;

		if ((*i)->isRW() == false) return true;
	}

	return false;
}